

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  FILE *f;
  int *piVar3;
  ulong uVar4;
  IMmu *pIVar5;
  long *plVar6;
  uint uVar7;
  uint16_t y;
  short sVar8;
  uint16_t x;
  int iVar9;
  undefined8 unaff_R13;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view format_str_03;
  string_view format_str_04;
  format_args args_02;
  undefined1 auVar10 [12];
  string rom;
  Nes nes;
  ifstream fs;
  allocator<char> local_2b9;
  long *local_2b8;
  undefined8 uStack_2b0;
  long *local_2a8;
  undefined8 uStack_2a0;
  long local_298 [2];
  Nes local_288;
  long *local_238 [2];
  long local_228 [63];
  
  if (argc == 3) {
    n_e_s::nes::Nes::Nes(&local_288);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,argv[1],(allocator<char> *)local_238);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_238,argv[2],&local_2b9);
    plVar6 = local_238[0];
    piVar3 = __errno_location();
    iVar9 = *piVar3;
    *piVar3 = 0;
    uVar4 = strtol((char *)plVar6,(char **)&local_2b8,10);
    if (local_2b8 == plVar6) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((long)(int)uVar4 == uVar4) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = iVar9;
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      std::ifstream::ifstream(local_238,(string *)&local_2a8,_S_bin);
      n_e_s::nes::Nes::load_rom(&local_288,(istream *)local_238);
      local_2b8 = local_2a8;
      uStack_2b0 = uStack_2a0;
      format_str.size_ = 0x12;
      format_str.data_ = "Running rom: \"{}\"\n";
      args.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_2b8;
      args.desc_ = 0xd;
      fmt::v8::vprint(format_str,args);
      local_2b8 = (long *)(uVar4 & 0xffffffff);
      format_str_00.size_ = 0xd;
      format_str_00.data_ = "Cycles: \"{}\"\n";
      args_00.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_2b8;
      args_00.desc_ = 1;
      fmt::v8::vprint(format_str_00,args_00);
      if (0 < (int)uVar4) {
        do {
          n_e_s::nes::Nes::execute(&local_288);
          uVar7 = (int)uVar4 - 1;
          uVar4 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      uVar4 = CONCAT62((int6)((ulong)unaff_R13 >> 0x10),0x2000);
      sVar8 = 0;
      do {
        iVar9 = 0;
        do {
          pIVar5 = n_e_s::nes::Nes::ppu_mmu(&local_288);
          uVar7 = iVar9 + (int)uVar4;
          uVar7 = (*pIVar5->_vptr_IMmu[3])
                            (pIVar5,(ulong)(ushort)uVar7,pIVar5->_vptr_IMmu,(ulong)uVar7);
          local_2b8 = (long *)(ulong)(uVar7 & 0xff);
          format_str_01.size_ = 7;
          format_str_01.data_ = "{:02X},";
          args_01.field_1.values_ =
               (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_2b8;
          args_01.desc_ = 2;
          fmt::v8::vprint(format_str_01,args_01);
          iVar9 = iVar9 + 1;
        } while ((short)iVar9 != 0x20);
        format_str_02.size_ = 1;
        format_str_02.data_ = "\n";
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_2b8;
        fmt::v8::vprint(format_str_02,(format_args)(auVar1 << 0x40));
        sVar8 = sVar8 + 1;
        uVar4 = (ulong)((int)uVar4 + 0x20);
      } while (sVar8 != 0x1e);
      std::ifstream::~ifstream(local_238);
      if (local_2a8 != local_298) {
        operator_delete(local_2a8,local_298[0] + 1);
      }
      n_e_s::nes::Nes::~Nes(&local_288);
      return 0;
    }
    auVar10 = std::__throw_out_of_range("stoi");
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
    n_e_s::nes::Nes::~Nes(&local_288);
    if (auVar10._8_4_ != 1) {
      _Unwind_Resume(auVar10._0_8_);
    }
    plVar6 = (long *)__cxa_begin_catch(auVar10._0_8_);
    f = _stderr;
    local_238[0] = (long *)(**(code **)(*plVar6 + 0x10))(plVar6);
    format_str_04.size_ = 0xe;
    format_str_04.data_ = "Exception: {}\n";
    args_02.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_238;
    args_02.desc_ = 0xc;
    fmt::v8::vprint(f,format_str_04,args_02);
    __cxa_end_catch();
  }
  else {
    format_str_03.size_ = 0x2a;
    format_str_03.data_ = "Expected two argument; <rom.nes> <cycles>\n";
    auVar2._8_8_ = 0;
    auVar2._0_8_ = &local_288;
    fmt::v8::vprint(_stderr,format_str_03,(format_args)(auVar2 << 0x40));
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) try {
    if (argc != 3) {
        fmt::print(stderr, "Expected two argument; <rom.nes> <cycles>\n");
        return 1;
    }

    n_e_s::nes::Nes nes;
    const std::string rom = argv[1];
    const int cycles = std::stoi(argv[2]);
    std::ifstream fs(rom, std::ios::binary);
    nes.load_rom(fs);

    fmt::print("Running rom: \"{}\"\n", rom);
    fmt::print("Cycles: \"{}\"\n", cycles);

    for (int i = 0; i < cycles; ++i) {
        nes.execute();
    }
    print_nametable(nes);
} catch (const std::exception &e) {
    fmt::print(stderr, "Exception: {}\n", e.what());
    return 1;
}